

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O2

void __thiscall pmx::PmxModel::~PmxModel(PmxModel *this)

{
  std::unique_ptr<pmx::PmxSoftBody[],_std::default_delete<pmx::PmxSoftBody[]>_>::~unique_ptr
            (&this->soft_bodies);
  std::unique_ptr<pmx::PmxJoint[],_std::default_delete<pmx::PmxJoint[]>_>::~unique_ptr
            (&this->joints);
  std::unique_ptr<pmx::PmxRigidBody[],_std::default_delete<pmx::PmxRigidBody[]>_>::~unique_ptr
            (&this->rigid_bodies);
  std::unique_ptr<pmx::PmxFrame[],_std::default_delete<pmx::PmxFrame[]>_>::~unique_ptr
            (&this->frames);
  std::unique_ptr<pmx::PmxMorph[],_std::default_delete<pmx::PmxMorph[]>_>::~unique_ptr
            (&this->morphs);
  std::unique_ptr<pmx::PmxBone[],_std::default_delete<pmx::PmxBone[]>_>::~unique_ptr(&this->bones);
  std::unique_ptr<pmx::PmxMaterial[],_std::default_delete<pmx::PmxMaterial[]>_>::~unique_ptr
            (&this->materials);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
  ::~unique_ptr(&this->textures);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(&this->indices);
  std::unique_ptr<pmx::PmxVertex[],_std::default_delete<pmx::PmxVertex[]>_>::~unique_ptr
            (&this->vertices);
  std::__cxx11::string::~string((string *)&this->model_english_comment);
  std::__cxx11::string::~string((string *)&this->model_comment);
  std::__cxx11::string::~string((string *)&this->model_english_name);
  std::__cxx11::string::~string((string *)&this->model_name);
  return;
}

Assistant:

PmxModel()
			: version(0.0f)
			, vertex_count(0)
			, index_count(0)
			, texture_count(0)
			, material_count(0)
			, bone_count(0)
			, morph_count(0)
			, frame_count(0)
			, rigid_body_count(0)
			, joint_count(0)
			, soft_body_count(0)
		{}